

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

void __thiscall re2::Regexp::AddRuneToString(Regexp *this,Rune r)

{
  int i;
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = (this->field_7).field_0.max_;
  if ((ulong)uVar5 == 0) {
    pvVar3 = operator_new__(0x20);
    (this->field_7).the_union_[1] = pvVar3;
    uVar5 = 0;
  }
  else if ((7 < (int)uVar5) &&
          (uVar4 = uVar5 - (uVar5 >> 1 & 0x55555555),
          uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333),
          ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
    pvVar3 = (this->field_7).the_union_[1];
    pvVar1 = operator_new__((ulong)uVar5 << 3);
    (this->field_7).the_union_[1] = pvVar1;
    lVar2 = 0;
    do {
      *(undefined4 *)((long)&(((this->field_7).field_1.name_)->_M_dataplus)._M_p + lVar2 * 4) =
           *(undefined4 *)((long)pvVar3 + lVar2 * 4);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->field_7).field_0.max_);
    operator_delete__(pvVar3);
    uVar5 = (this->field_7).field_0.max_;
  }
  (this->field_7).field_0.max_ = uVar5 + 1;
  *(Rune *)((long)&(((this->field_7).field_1.name_)->_M_dataplus)._M_p + (long)(int)uVar5 * 4) = r;
  return;
}

Assistant:

void Regexp::AddRuneToString(Rune r) {
  DCHECK(op_ == kRegexpLiteralString);
  if (nrunes_ == 0) {
    // start with 8
    runes_ = new Rune[8];
  } else if (nrunes_ >= 8 && (nrunes_ & (nrunes_ - 1)) == 0) {
    // double on powers of two
    Rune *old = runes_;
    runes_ = new Rune[nrunes_ * 2];
    for (int i = 0; i < nrunes_; i++)
      runes_[i] = old[i];
    delete[] old;
  }

  runes_[nrunes_++] = r;
}